

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O3

int intersectRectQuad2(cbtScalar *h,cbtScalar *p,cbtScalar *ret)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  cbtScalar *pcVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  cbtScalar *pcVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  cbtScalar *pcVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 in_register_00001384 [12];
  cbtScalar buffer [16];
  cbtScalar local_78 [18];
  
  uVar8 = 4;
  uVar7 = 0;
  pcVar10 = ret;
  bVar17 = true;
  do {
    bVar4 = bVar17;
    uVar11 = uVar7 ^ 1;
    pcVar16 = p;
    iVar15 = -1;
    do {
      p = pcVar10;
      uVar5 = 0;
      if (0 < (int)uVar8) {
        auVar18._0_4_ = (float)iVar15;
        auVar18._4_12_ = in_register_00001384;
        iVar9 = uVar8 + 1;
        lVar13 = 0;
        uVar8 = 0;
        pcVar10 = p;
        lVar12 = uVar7 * 4;
        lVar14 = uVar11 * 4;
        do {
          fVar1 = *(float *)((long)pcVar16 + lVar12);
          fVar2 = h[uVar7];
          fVar19 = fVar1 * auVar18._0_4_;
          if (fVar19 < fVar2) {
            uVar8 = uVar8 + 1;
            *pcVar10 = *(cbtScalar *)((long)pcVar16 + lVar13);
            pcVar10[1] = *(cbtScalar *)((long)pcVar16 + lVar13 + 4);
            if ((uVar8 & 8) != 0) goto LAB_008c4d9b;
            fVar1 = *(float *)((long)pcVar16 + lVar12);
            fVar2 = h[uVar7];
            pcVar10 = pcVar10 + 2;
            fVar19 = fVar1 * auVar18._0_4_;
          }
          pcVar6 = (cbtScalar *)((long)pcVar16 + lVar13 + 8);
          if (iVar9 == 2) {
            pcVar6 = pcVar16;
          }
          if (fVar19 < fVar2 != pcVar6[uVar7] * auVar18._0_4_ < fVar2) {
            auVar3 = vfmsub213ss_fma(ZEXT416((uint)fVar2),auVar18,ZEXT416((uint)fVar1));
            uVar8 = uVar8 + 1;
            auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)((pcVar6[uVar11] -
                                                           *(float *)((long)pcVar16 + lVar14)) /
                                                          (pcVar6[uVar7] - fVar1))),
                                     ZEXT416((uint)*(float *)((long)pcVar16 + lVar14)));
            pcVar10[uVar11] = auVar3._0_4_;
            pcVar10[uVar7] = auVar18._0_4_ * h[uVar7];
            if ((uVar8 & 8) != 0) goto LAB_008c4d9b;
            pcVar10 = pcVar10 + 2;
          }
          iVar9 = iVar9 + -1;
          lVar12 = lVar12 + 8;
          lVar14 = lVar14 + 8;
          lVar13 = lVar13 + 8;
          uVar5 = uVar8;
        } while (1 < iVar9);
      }
      uVar8 = uVar5;
      pcVar10 = ret;
      if (p == ret) {
        pcVar10 = local_78;
      }
      bVar17 = iVar15 < 0;
      pcVar16 = p;
      iVar15 = iVar15 + 2;
    } while (bVar17);
    uVar7 = 1;
    bVar17 = false;
  } while (bVar4);
LAB_008c4d9b:
  if (p != ret) {
    memcpy(ret,p,(long)(int)(uVar8 * 2) << 2);
  }
  return uVar8;
}

Assistant:

static int intersectRectQuad2(cbtScalar h[2], cbtScalar p[8], cbtScalar ret[16])
{
	// q (and r) contain nq (and nr) coordinate points for the current (and
	// chopped) polygons
	int nq = 4, nr = 0;
	cbtScalar buffer[16];
	cbtScalar* q = p;
	cbtScalar* r = ret;
	for (int dir = 0; dir <= 1; dir++)
	{
		// direction notation: xy[0] = x axis, xy[1] = y axis
		for (int sign = -1; sign <= 1; sign += 2)
		{
			// chop q along the line xy[dir] = sign*h[dir]
			cbtScalar* pq = q;
			cbtScalar* pr = r;
			nr = 0;
			for (int i = nq; i > 0; i--)
			{
				// go through all points in q and all lines between adjacent points
				if (sign * pq[dir] < h[dir])
				{
					// this point is inside the chopping line
					pr[0] = pq[0];
					pr[1] = pq[1];
					pr += 2;
					nr++;
					if (nr & 8)
					{
						q = r;
						goto done;
					}
				}
				cbtScalar* nextq = (i > 1) ? pq + 2 : q;
				if ((sign * pq[dir] < h[dir]) ^ (sign * nextq[dir] < h[dir]))
				{
					// this line crosses the chopping line
					pr[1 - dir] = pq[1 - dir] + (nextq[1 - dir] - pq[1 - dir]) /
													(nextq[dir] - pq[dir]) * (sign * h[dir] - pq[dir]);
					pr[dir] = sign * h[dir];
					pr += 2;
					nr++;
					if (nr & 8)
					{
						q = r;
						goto done;
					}
				}
				pq += 2;
			}
			q = r;
			r = (q == ret) ? buffer : ret;
			nq = nr;
		}
	}
done:
	if (q != ret) memcpy(ret, q, nr * 2 * sizeof(cbtScalar));
	return nr;
}